

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall printing_callbacks::on_boolean(printing_callbacks *this,bool value)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"bool: ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) | 1;
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void on_boolean(bool value)
    {
        std::cout << "bool: " << std::boolalpha << value << std::endl;
    }